

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  Column *this;
  size_type sVar6;
  long *in_RDI;
  string description;
  Colour colourGuard;
  Code colour;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec *testSpec;
  undefined4 in_stack_fffffffffffffd08;
  Code in_stack_fffffffffffffd0c;
  pluralise *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  Column *in_stack_fffffffffffffd20;
  IConfig *in_stack_fffffffffffffd58;
  allocator *paVar7;
  TestSpec *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  TestCaseInfo *in_stack_fffffffffffffd78;
  Column *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  allocator local_219;
  string local_218 [79];
  allocator local_1c9;
  string local_1c8 [72];
  string local_180 [32];
  Column local_160;
  Column local_130;
  string local_100 [32];
  string local_e0 [32];
  Column local_c0;
  Column local_90;
  undefined4 local_4c;
  reference local_48;
  TestCase *local_40;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_38;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_30;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_28;
  undefined8 local_10;
  long *local_8;
  
  local_8 = in_RDI;
  local_10 = (**(code **)(*in_RDI + 0x68))();
  uVar4 = (**(code **)(*local_8 + 0x70))();
  if ((uVar4 & 1) == 0) {
    poVar5 = cout();
    std::operator<<(poVar5,"All available test cases:\n");
  }
  else {
    poVar5 = cout();
    std::operator<<(poVar5,"Matching test cases:\n");
  }
  getAllTestCasesSorted((IConfig *)0x2336c0);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_30 = &local_28;
  local_38._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_40 = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)), bVar1
        ) {
    local_48 = __gnu_cxx::
               __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_38);
    bVar1 = TestCaseInfo::isHidden(&local_48->super_TestCaseInfo);
    local_4c = 0;
    if (bVar1) {
      local_4c = 0x17;
    }
    Colour::Colour((Colour *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
    cout();
    clara::TextFlow::Column::Column(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    this = clara::TextFlow::Column::initialIndent(&local_90,2);
    clara::TextFlow::Column::indent(this,4);
    poVar5 = clara::TextFlow::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::operator<<(poVar5,"\n");
    clara::TextFlow::Column::~Column((Column *)0x233834);
    iVar3 = (**(code **)(*local_8 + 0xa0))();
    if (1 < iVar3) {
      in_stack_fffffffffffffdb0 = cout();
      Detail::stringify<Catch::SourceLineInfo>
                ((SourceLineInfo *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      clara::TextFlow::Column::Column(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      in_stack_fffffffffffffda8 = clara::TextFlow::Column::indent(&local_c0,4);
      poVar5 = clara::TextFlow::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column((Column *)0x233903);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::string(local_100,(string *)&(local_48->super_TestCaseInfo).description);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::operator=(local_100,"(NO DESCRIPTION)");
      }
      cout();
      clara::TextFlow::Column::Column(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      clara::TextFlow::Column::indent(&local_130,4);
      poVar5 = clara::TextFlow::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column((Column *)0x233a9a);
      std::__cxx11::string::~string(local_100);
    }
    bVar1 = clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&in_stack_fffffffffffffd20->m_strings);
    if (!bVar1) {
      cout();
      TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_fffffffffffffd78);
      clara::TextFlow::Column::Column(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd78 = (TestCaseInfo *)clara::TextFlow::Column::indent(&local_160,6);
      poVar5 = clara::TextFlow::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::operator<<(poVar5,"\n");
      clara::TextFlow::Column::~Column((Column *)0x233b7e);
      std::__cxx11::string::~string(local_180);
    }
    Colour::~Colour((Colour *)0x233be0);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_38);
  }
  bVar2 = (**(code **)(*local_8 + 0x70))();
  if ((bVar2 & 1) == 0) {
    cout();
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(&local_28);
    paVar7 = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"test case",paVar7);
    pluralise::pluralise
              (in_stack_fffffffffffffd10,
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),(string *)0x233c8e);
    poVar5 = operator<<((ostream *)in_stack_fffffffffffffd10,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    poVar5 = std::operator<<(poVar5,'\n');
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x233cdf);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  else {
    cout();
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(&local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"matching test case",&local_219);
    pluralise::pluralise
              (in_stack_fffffffffffffd10,
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),(string *)0x233dcf);
    in_stack_fffffffffffffd20 =
         (Column *)
         operator<<((ostream *)in_stack_fffffffffffffd10,
                    (pluralise *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffd20,'\n');
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x233e20);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  sVar6 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(&local_28);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffd20)
  ;
  return sVar6;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
        }

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Column( testCaseInfo.name ).initialIndent( 2 ).indent( 4 ) << "\n";
            if( config.verbosity() >= Verbosity::High ) {
                Catch::cout() << Column( Catch::Detail::stringify( testCaseInfo.lineInfo ) ).indent(4) << std::endl;
                std::string description = testCaseInfo.description;
                if( description.empty() )
                    description = "(NO DESCRIPTION)";
                Catch::cout() << Column( description ).indent(4) << std::endl;
            }
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Column( testCaseInfo.tagsAsString() ).indent( 6 ) << "\n";
        }

        if( !config.hasTestFilters() )
            Catch::cout() << pluralise( matchedTestCases.size(), "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTestCases.size(), "matching test case" ) << '\n' << std::endl;
        return matchedTestCases.size();
    }